

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipState.hpp
# Opt level: O0

void __thiscall
linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>::Init
          (SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>
           *this)

{
  bool local_19;
  SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int> *this_local
  ;
  
  this->current = 0;
  ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::Init(&this->source);
  while( true ) {
    local_19 = false;
    if (this->current < this->count) {
      local_19 = ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::Valid
                           (&this->source);
    }
    if (local_19 == false) break;
    ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::Advance(&this->source);
    this->current = this->current + 1;
  }
  return;
}

Assistant:

void Init() override final
			{
				current = 0;
				source.Init(); 
				
				while(current < count && source.Valid()) {
					source.Advance();
					current++;
				}
			}